

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int __thiscall mpt::client::convert(client *this,type_t type,void *ptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  path p;
  path local_40;
  
  if (((type_properties<mpt::client_*>::id::traits == (named_traits *)0x0) &&
      (type_properties<mpt::client_*>::id::traits = (named_traits *)mpt_client_type_traits(),
      type_properties<mpt::client_*>::id::traits == (named_traits *)0x0)) ||
     (iVar3 = (int)type_properties<mpt::client_*>::id::traits->type, iVar3 < 0)) {
    iVar3 = 0x100;
  }
  else {
    local_40.base = (char *)this;
    bVar1 = assign<mpt::client*>((client **)&local_40,(int)type,ptr);
    if (bVar1) {
      return 0x85;
    }
  }
  if (type != 0x85) {
    if (type == 0) {
      if (ptr == (void *)0x0) {
        return iVar3;
      }
      *(uint8_t **)ptr = convert::fmt;
      return iVar3;
    }
    if (ptr != (void *)0x0 && (type & 0xffffffff) == 0x100) {
      *(client **)ptr = this;
    }
    if ((int)type != 0x100) {
      return -3;
    }
    return 0x85;
  }
  if (ptr == (void *)0x0) {
    return iVar3;
  }
  if (cfg == (metatype *)0x0) {
    path::path(&local_40,(char *)0x0,0x2e,0);
    path::set(&local_40,"mpt.client",-1,-1,-1);
    cfg = config::global(&local_40);
    if (cfg == (metatype *)0x0) {
      path::~path(&local_40);
      pcVar4 = (char *)0x0;
      goto LAB_0012975c;
    }
    atexit(unrefConfig);
    path::~path(&local_40);
  }
  local_40.base = (char *)0x0;
  iVar2 = (**(cfg->super_convertable)._vptr_convertable)(cfg,0x85);
  pcVar4 = (char *)0x0;
  if (-1 < iVar2) {
    pcVar4 = local_40.base;
  }
LAB_0012975c:
  *(char **)ptr = pcVar4;
  return iVar3;
}

Assistant:

int client::convert(type_t type, void *ptr)
{
	int me = type_properties<client *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return TypeConfigPtr;
	}
	if (!type) {
		static const uint8_t fmt[] = { TypeConfigPtr, 0 };
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	int cfg = type_properties<class config *>::id(true);
	if ((cfg > 0) && (type == static_cast<type_t>(cfg))) {
		if (ptr) *static_cast<class config **>(ptr) = clientConfig();
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		return TypeConfigPtr;
	}
	return BadType;
}